

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_launcher.cpp
# Opt level: O0

void lscpp::write_lsp_message(transporter *t,string *content)

{
  string *psVar1;
  ulong uVar2;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream content_length;
  ostream local_190 [376];
  string *local_18;
  string *content_local;
  transporter *t_local;
  
  local_18 = content;
  content_local = (string *)t;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Content-Length: ");
  uVar2 = std::__cxx11::string::size();
  std::ostream::operator<<(local_190,uVar2);
  psVar1 = content_local;
  std::__cxx11::stringstream::str();
  transporter::write_message((transporter *)psVar1,&local_1d0,true);
  std::__cxx11::string::~string((string *)&local_1d0);
  psVar1 = content_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f1);
  transporter::write_message((transporter *)psVar1,&local_1f0,true);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  transporter::write_message((transporter *)content_local,local_18,false);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void write_lsp_message(transporter &t, std::string const &content) {
  std::stringstream content_length;
  content_length << "Content-Length: ";
  content_length << content.size();
  t.write_message(content_length.str(), true);
  t.write_message("", true);

  t.write_message(content);
}